

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O2

Ref<embree::XML> __thiscall
embree::parseHeader(embree *this,Ref<embree::Stream<embree::Token>_> *cin)

{
  bool bVar1;
  XML *pXVar2;
  Token *pTVar3;
  runtime_error *this_00;
  allocator local_111;
  XML *local_110;
  XML *local_108;
  Token local_100;
  string local_b8;
  Token local_98;
  string local_50;
  
  local_108 = (XML *)this;
  pXVar2 = (XML *)::operator_new(0xb0);
  local_110 = pXVar2;
  std::__cxx11::string::string((string *)&local_100,"",(allocator *)&local_98);
  XML::XML(pXVar2,(string *)&local_100);
  (local_108->super_RefCount)._vptr_RefCount = (_func_int **)pXVar2;
  (*(pXVar2->super_RefCount)._vptr_RefCount[2])(pXVar2);
  std::__cxx11::string::~string((string *)&local_100);
  Stream<embree::Token>::get(&local_100,cin->ptr);
  std::__cxx11::string::string((string *)&local_b8,"<?",&local_111);
  Token::Sym(&local_98,&local_b8);
  bVar1 = operator!=(&local_100,&local_98);
  Token::~Token(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  Token::~Token(&local_100);
  pXVar2 = local_110;
  if (!bVar1) {
    Stream<embree::Token>::get(&local_100,cin->ptr);
    Token::Identifier_abi_cxx11_((string *)&local_98,&local_100);
    std::__cxx11::string::operator=((string *)&pXVar2->name,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    Token::~Token(&local_100);
    parseComments(cin);
    while( true ) {
      pTVar3 = Stream<embree::Token>::peek(cin->ptr);
      std::__cxx11::string::string((string *)&local_50,"?>",(allocator *)&local_98);
      Token::Sym(&local_100,&local_50);
      bVar1 = operator!=(pTVar3,&local_100);
      Token::~Token(&local_100);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar1) break;
      parseParm(cin,&pXVar2->parms);
      parseComments(cin);
    }
    Stream<embree::Token>::drop(cin->ptr);
    return (Ref<embree::XML>)local_108;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pTVar3 = Stream<embree::Token>::unget(cin->ptr,1);
  ParseLocation::str_abi_cxx11_((string *)&local_98,&pTVar3->loc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 ": wrong XML header");
  std::runtime_error::runtime_error(this_00,(string *)&local_100);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<XML> parseHeader(Ref<Stream<Token> >& cin)
  {
    Ref<XML> xml = new XML;
    if (cin->get() != Token::Sym("<?")) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": wrong XML header");
    xml->name = cin->get().Identifier();
    parseComments(cin);
    while (cin->peek() != Token::Sym("?>")) {
      parseParm(cin,xml->parms);
      parseComments(cin);
    }
    cin->drop();
    return xml;
  }